

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void sprite(dw_rom *rom,char *sprite_name)

{
  char *pcVar1;
  code *pcVar2;
  char *__s1;
  long lVar3;
  int iVar4;
  size_t sVar5;
  ulong auStack_50 [2];
  undefined8 *local_40 [2];
  ulong local_30;
  size_t i;
  unsigned_long __vla_expr0;
  char *local_18;
  char *sprite_name_local;
  dw_rom *rom_local;
  
  auStack_50[0] = 0x102695;
  local_18 = sprite_name;
  sprite_name_local = (char *)rom;
  sVar5 = sprite_count();
  pcVar1 = local_18;
  i = sVar5 - 2;
  lVar3 = -(sVar5 * 8 - 1 & 0xfffffffffffffff0);
  local_40[0] = (undefined8 *)((long)local_40 + lVar3 + -8);
  if ((sprite_name_local[0x3a] & 0xcU) == 0) {
    *local_40[0] = gwaelin;
    *(code **)((long)local_40 + lVar3) = slime;
    *(code **)((long)local_40 + lVar3 + 8) = red_slime;
    *(code **)((long)&local_30 + lVar3) = metal_slime;
    *(code **)((long)&i + lVar3) = dragonlord;
    *(code **)((long)&__vla_expr0 + lVar3) = dw2_cannock;
    *(code **)((long)&local_18 + lVar3) = dw2_midenhall;
    *(code **)((long)&sprite_name_local + lVar3) = dw2_moonbrooke;
    *(code **)((long)&rom_local + lVar3) = dw3_female_fighter;
    *(code **)(&stack0x00000000 + lVar3) = dw3_male_fighter;
    *(code **)(&stack0x00000008 + lVar3) = dw3_female_goof_off;
    *(code **)(&stack0x00000010 + lVar3) = dw3_male_goof_off;
    *(code **)(&stack0x00000018 + lVar3) = dw3_ghost;
    *(code **)(&stack0x00000020 + lVar3) = dw3_hero;
    *(code **)(&stack0x00000028 + lVar3) = dw3_female_merchant;
    *(code **)(&stack0x00000030 + lVar3) = dw3_male_merchant;
    *(code **)(&stack0x00000038 + lVar3) = dw3_female_pilgrim;
    *(code **)(&stack0x00000040 + lVar3) = dw3_male_pilgrim;
    *(code **)(&stack0x00000048 + lVar3) = dw3_female_sage;
    *(code **)(&stack0x00000050 + lVar3) = dw3_male_sage;
    *(code **)(&stack0x00000058 + lVar3) = dw3_female_soldier;
    *(code **)(&stack0x00000060 + lVar3) = dw3_male_soldier;
    *(code **)(&stack0x00000068 + lVar3) = dw3_female_wizard;
    *(code **)(&stack0x00000070 + lVar3) = dw3_male_wizard;
    *(code **)(&stack0x00000078 + lVar3) = dw4_alena;
    *(code **)(&stack0x00000080 + lVar3) = dw4_brey;
    *(code **)(&stack0x00000088 + lVar3) = dw4_celia;
    *(code **)(&stack0x00000090 + lVar3) = dw4_cristo;
    *(code **)(&stack0x00000098 + lVar3) = doran;
    *(code **)(&stack0x000000a0 + lVar3) = dw4_healie;
    *(code **)(&stack0x000000a8 + lVar3) = dw4_heroine;
    *(code **)(&stack0x000000b0 + lVar3) = dw4_hero;
    *(code **)(&stack0x000000b8 + lVar3) = dw4_mara;
    *(code **)(&stack0x000000c0 + lVar3) = dw4_nara;
    *(code **)(&stack0x000000c8 + lVar3) = dw4_ragnar;
    *(code **)(&stack0x000000d0 + lVar3) = dw4_taloon;
    *(code **)(&stack0x000000d8 + lVar3) = dw4_tov_the_dog;
    *(code **)(&stack0x000000e0 + lVar3) = dw4_yeti;
    *(code **)(&stack0x000000e8 + lVar3) = ff_black_belt;
    *(code **)(&stack0x000000f0 + lVar3) = ff_black_mage;
    *(code **)(&stack0x000000f8 + lVar3) = ff_black_wizard;
    *(code **)(&stack0x00000100 + lVar3) = ff_fighter;
    *(code **)(&stack0x00000108 + lVar3) = ff_knight;
    *(code **)(&stack0x00000110 + lVar3) = ff_master;
    *(code **)(&stack0x00000118 + lVar3) = ff_ninja;
    *(code **)(&stack0x00000120 + lVar3) = ff_red_mage;
    *(code **)(&stack0x00000128 + lVar3) = ff_red_wizard;
    *(code **)(&stack0x00000130 + lVar3) = ff_thief;
    *(code **)(&stack0x00000138 + lVar3) = ff_white_mage;
    *(code **)(&stack0x00000140 + lVar3) = ff_white_wizard;
    *(code **)(&stack0x00000148 + lVar3) = ff4_cecil;
    *(code **)(&stack0x00000150 + lVar3) = ff4_edge;
    *(code **)(&stack0x00000158 + lVar3) = link;
    *(code **)(&stack0x00000160 + lVar3) = mario;
    *(code **)(&stack0x00000168 + lVar3) = luigi;
    *(code **)(&stack0x00000170 + lVar3) = yoshi;
    *(code **)(&stack0x00000178 + lVar3) = wario;
    *(code **)(&stack0x00000180 + lVar3) = waluigi;
    *(code **)(&stack0x00000188 + lVar3) = pacman;
    *(code **)(&stack0x00000190 + lVar3) = ms_pacman;
    *(code **)(&stack0x00000198 + lVar3) = inky;
    *(code **)(&stack0x000001a0 + lVar3) = blinky;
    *(code **)(&stack0x000001a8 + lVar3) = pinky;
    *(code **)(&stack0x000001b0 + lVar3) = clyde;
    *(code **)(&stack0x000001b8 + lVar3) = sue;
    *(code **)(&stack0x000001c0 + lVar3) = blaster_master;
    *(code **)(&stack0x000001c8 + lVar3) = bomberman;
    *(code **)(&stack0x000001d0 + lVar3) = christine;
    *(code **)(&stack0x000001d8 + lVar3) = kirby;
    *(code **)(&stack0x000001e0 + lVar3) = lala;
    *(code **)(&stack0x000001e8 + lVar3) = lolo;
    *(code **)(&stack0x000001f0 + lVar3) = st_mike;
    *(code **)(&stack0x000001f8 + lVar3) = mina_the_hollower;
    *(code **)(&stack0x00000200 + lVar3) = plumplim;
    *(code **)(&stack0x00000208 + lVar3) = guanyu;
    *(code **)(&stack0x00000210 + lVar3) = zhangfei;
    *(code **)(&stack0x00000218 + lVar3) = zhaoyun;
    *(code **)(&stack0x00000220 + lVar3) = huangzhong;
    *(code **)(&stack0x00000228 + lVar3) = machao;
    *(code **)(&stack0x00000230 + lVar3) = zhugeliang;
    *(code **)(&stack0x00000238 + lVar3) = jiangwei;
    *(code **)(&stack0x00000240 + lVar3) = lubu;
    *(code **)(&stack0x00000248 + lVar3) = bo_jackson;
    *(code **)(&stack0x00000250 + lVar3) = jerry_rice;
    local_30 = 0x55;
    *(code **)(&stack0x00000258 + lVar3) = barry_sanders;
    __vla_expr0 = (unsigned_long)(auStack_50 + 1);
    *(undefined8 *)((long)auStack_50 + lVar3) = 0x102f9d;
    iVar4 = strcmp("Random",pcVar1);
    if (iVar4 == 0) {
      *(undefined8 *)((long)auStack_50 + lVar3) = 0x102fa7;
      sVar5 = sprite_count();
      *(undefined8 *)((long)auStack_50 + lVar3) = 0x102fb8;
      local_30 = mt_rand(2,sVar5 - 1);
      pcVar1 = dwr_sprite_names[local_30];
      *(undefined8 *)((long)auStack_50 + lVar3) = 0x102fd9;
      printf("Setting player sprite to %s...\n",pcVar1);
      pcVar1 = sprite_name_local;
      pcVar2 = (code *)local_40[0][local_30 - 2];
      *(undefined8 *)((long)auStack_50 + lVar3) = 0x102fef;
      (*pcVar2)(pcVar1);
    }
    else {
      local_30 = 2;
      while( true ) {
        auStack_50[1] = local_30;
        *(undefined8 *)((long)auStack_50 + lVar3) = 0x103006;
        sVar5 = sprite_count();
        pcVar1 = local_18;
        if (sVar5 <= auStack_50[1]) break;
        __s1 = dwr_sprite_names[local_30];
        *(undefined8 *)((long)auStack_50 + lVar3) = 0x10302a;
        iVar4 = strcmp(__s1,pcVar1);
        pcVar1 = local_18;
        if (iVar4 == 0) {
          *(undefined8 *)((long)auStack_50 + lVar3) = 0x103041;
          printf("Setting player sprite to %s...\n",pcVar1);
          pcVar1 = sprite_name_local;
          pcVar2 = (code *)local_40[0][local_30 - 2];
          *(undefined8 *)((long)auStack_50 + lVar3) = 0x103057;
          (*pcVar2)(pcVar1);
          return;
        }
        local_30 = local_30 + 1;
      }
    }
  }
  return;
}

Assistant:

void sprite(dw_rom *rom, const char *sprite_name)
{
    void (*sprite_func[sprite_count()-2])(dw_rom *rom);
    size_t i=0;

    if (INVISIBLE_HERO(rom)) {
        return;
    }

    sprite_func[i++] = &gwaelin;
    sprite_func[i++] = &slime;
    sprite_func[i++] = &red_slime;
    sprite_func[i++] = &metal_slime;
    sprite_func[i++] = &dragonlord;

    sprite_func[i++] = &dw2_cannock;
    sprite_func[i++] = &dw2_midenhall;
    sprite_func[i++] = &dw2_moonbrooke;

    sprite_func[i++] = &dw3_female_fighter;
    sprite_func[i++] = &dw3_male_fighter;

    sprite_func[i++] = &dw3_female_goof_off;
    sprite_func[i++] = &dw3_male_goof_off;
    sprite_func[i++] = &dw3_ghost;
    sprite_func[i++] = &dw3_hero;
    sprite_func[i++] = &dw3_female_merchant;
    sprite_func[i++] = &dw3_male_merchant;
    sprite_func[i++] = &dw3_female_pilgrim;
    sprite_func[i++] = &dw3_male_pilgrim;
    sprite_func[i++] = &dw3_female_sage;
    sprite_func[i++] = &dw3_male_sage;
    sprite_func[i++] = &dw3_female_soldier;
    sprite_func[i++] = &dw3_male_soldier;
    sprite_func[i++] = &dw3_female_wizard;
    sprite_func[i++] = &dw3_male_wizard;

    sprite_func[i++] = &dw4_alena;
    sprite_func[i++] = &dw4_brey;
    sprite_func[i++] = &dw4_celia;
    sprite_func[i++] = &dw4_cristo;
    sprite_func[i++] = &doran;
    sprite_func[i++] = &dw4_healie;
    sprite_func[i++] = &dw4_heroine;
    sprite_func[i++] = &dw4_hero;
    sprite_func[i++] = &dw4_mara;
    sprite_func[i++] = &dw4_nara;
    sprite_func[i++] = &dw4_ragnar;
    sprite_func[i++] = &dw4_taloon;
    sprite_func[i++] = &dw4_tov_the_dog;
    sprite_func[i++] = &dw4_yeti;

    sprite_func[i++] = &ff_black_belt;
    sprite_func[i++] = &ff_black_mage;
    sprite_func[i++] = &ff_black_wizard;
    sprite_func[i++] = &ff_fighter;
    sprite_func[i++] = &ff_knight;
    sprite_func[i++] = &ff_master;
    sprite_func[i++] = &ff_ninja;
    sprite_func[i++] = &ff_red_mage;
    sprite_func[i++] = &ff_red_wizard;
    sprite_func[i++] = &ff_thief;
    sprite_func[i++] = &ff_white_mage;
    sprite_func[i++] = &ff_white_wizard;
    sprite_func[i++] = &ff4_cecil;
    sprite_func[i++] = &ff4_edge;

    sprite_func[i++] = &link;
    sprite_func[i++] = &mario;
    sprite_func[i++] = &luigi;
    sprite_func[i++] = &yoshi;
    sprite_func[i++] = &wario;
    sprite_func[i++] = &waluigi;

    sprite_func[i++] = &pacman;
    sprite_func[i++] = &ms_pacman;
    sprite_func[i++] = &inky;
    sprite_func[i++] = &blinky;
    sprite_func[i++] = &pinky;
    sprite_func[i++] = &clyde;
    sprite_func[i++] = &sue;

    sprite_func[i++] = &blaster_master;
    sprite_func[i++] = &bomberman;
    sprite_func[i++] = &christine;
    sprite_func[i++] = &kirby;
    sprite_func[i++] = &lala;
    sprite_func[i++] = &lolo;
    sprite_func[i++] = &st_mike;

    sprite_func[i++] = &mina_the_hollower;

    sprite_func[i++] = &plumplim;

    sprite_func[i++] = &guanyu;
    sprite_func[i++] = &zhangfei;
    sprite_func[i++] = &zhaoyun;
    sprite_func[i++] = &huangzhong;
    sprite_func[i++] = &machao;
    sprite_func[i++] = &zhugeliang;
    sprite_func[i++] = &jiangwei;
    sprite_func[i++] = &lubu;

    sprite_func[i++] = &bo_jackson;
    sprite_func[i++] = &jerry_rice;
    sprite_func[i++] = &barry_sanders;

    if (!strcmp("Random", sprite_name)) {

        i = mt_rand(2, sprite_count()-1);
        printf("Setting player sprite to %s...\n", dwr_sprite_names[i]);
        (*sprite_func[i-2])(rom);
    } else {
        for (i=2; i < sprite_count(); i++) {
            if (!strcmp(dwr_sprite_names[i], sprite_name)) {
                printf("Setting player sprite to %s...\n", sprite_name);
                (*sprite_func[i-2])(rom);
                break;
            }
        }
    }
}